

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

cmTarget * __thiscall
cmMakefile::AddUtilityCommand
          (cmMakefile *this,string *utilityName,bool excludeFromAll,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends,char *workingDirectory,char *command,char *arg1,char *arg2,char *arg3,char *arg4)

{
  pointer *ppcVar1;
  size_t sVar2;
  cmTarget *pcVar3;
  undefined7 in_register_00000011;
  cmCustomCommandLines commandLines;
  allocator local_5d;
  undefined4 local_5c;
  cmCustomCommandLine commandLine;
  
  commandLine.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commandLine.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  commandLine.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&commandLines,command,&local_5d);
  local_5c = (undefined4)CONCAT71(in_register_00000011,excludeFromAll);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commandLine,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&commandLines);
  ppcVar1 = &commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
             super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  if (commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
      super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)ppcVar1) {
    operator_delete(commandLines.
                    super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((commandLines.
                                     super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                     .
                                     super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  if (arg1 != (char *)0x0) {
    commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppcVar1;
    sVar2 = strlen(arg1);
    std::__cxx11::string::_M_construct<char_const*>((string *)&commandLines,arg1,arg1 + sVar2);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commandLine,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&commandLines);
    if (commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
        super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)ppcVar1) {
      operator_delete(commandLines.
                      super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                      super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((commandLines.
                                       super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                       .
                                       super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 1));
    }
  }
  if (arg2 != (char *)0x0) {
    commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppcVar1;
    sVar2 = strlen(arg2);
    std::__cxx11::string::_M_construct<char_const*>((string *)&commandLines,arg2,arg2 + sVar2);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commandLine,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&commandLines);
    if (commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
        super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)ppcVar1) {
      operator_delete(commandLines.
                      super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                      super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((commandLines.
                                       super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                       .
                                       super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 1));
    }
  }
  if (arg3 != (char *)0x0) {
    commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppcVar1;
    sVar2 = strlen(arg3);
    std::__cxx11::string::_M_construct<char_const*>((string *)&commandLines,arg3,arg3 + sVar2);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commandLine,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&commandLines);
    if (commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
        super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)ppcVar1) {
      operator_delete(commandLines.
                      super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                      super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((commandLines.
                                       super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                       .
                                       super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 1));
    }
  }
  if (arg4 != (char *)0x0) {
    commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppcVar1;
    sVar2 = strlen(arg4);
    std::__cxx11::string::_M_construct<char_const*>((string *)&commandLines,arg4,arg4 + sVar2);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commandLine,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&commandLines);
    if (commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
        super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)ppcVar1) {
      operator_delete(commandLines.
                      super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                      super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((commandLines.
                                       super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                       .
                                       super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 1));
    }
  }
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
            (&commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
             &commandLine);
  pcVar3 = AddUtilityCommand(this,utilityName,local_5c._0_1_,workingDirectory,depends,&commandLines,
                             true,(char *)0x0,false);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
            (&commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&commandLine.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  return pcVar3;
}

Assistant:

cmTarget*
cmMakefile::AddUtilityCommand(const std::string& utilityName,
                              bool excludeFromAll,
                              const std::vector<std::string>& depends,
                              const char* workingDirectory,
                              const char* command,
                              const char* arg1,
                              const char* arg2,
                              const char* arg3,
                              const char* arg4)
{
  // Construct the command line for the custom command.
  cmCustomCommandLine commandLine;
  commandLine.push_back(command);
  if(arg1)
    {
    commandLine.push_back(arg1);
    }
  if(arg2)
    {
    commandLine.push_back(arg2);
    }
  if(arg3)
    {
    commandLine.push_back(arg3);
    }
  if(arg4)
    {
    commandLine.push_back(arg4);
    }
  cmCustomCommandLines commandLines;
  commandLines.push_back(commandLine);

  // Call the real signature of this method.
  return this->AddUtilityCommand(utilityName, excludeFromAll, workingDirectory,
                                 depends, commandLines);
}